

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

void __thiscall crnlib::dxt_image::flip_col(dxt_image *this,uint x)

{
  uint block_x;
  uint uVar1;
  element_type eVar2;
  element *peVar3;
  uint in_ESI;
  dxt_image *in_RDI;
  uint i;
  element tmp [2];
  uint e;
  uint y;
  uint other_x;
  uint local_2c;
  undefined8 uVar4;
  uint w;
  dxt1_block *this_00;
  uint local_18;
  uint local_14;
  
  block_x = (in_RDI->m_blocks_x - 1) - in_ESI;
  for (local_14 = 0; local_14 < in_RDI->m_blocks_y; local_14 = local_14 + 1) {
    for (local_18 = 0; uVar1 = get_elements_per_block(in_RDI), local_18 < uVar1;
        local_18 = local_18 + 1) {
      peVar3 = get_element(in_RDI,in_ESI,local_14,local_18);
      uVar4 = *(undefined8 *)peVar3->m_bytes;
      peVar3 = get_element(in_RDI,block_x,local_14,local_18);
      this_00 = *(dxt1_block **)peVar3->m_bytes;
      for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
        eVar2 = get_element_type(in_RDI,local_18);
        uVar1 = (uint)uVar4;
        w = (uint)((ulong)uVar4 >> 0x20);
        if (eVar2 == cColorDXT1) {
          dxt1_block::flip_x(this_00,w,uVar1);
        }
        else if (eVar2 == cAlphaDXT3) {
          dxt3_block::flip_x((dxt3_block *)this_00,w,uVar1);
        }
        else if (eVar2 == cAlphaDXT5) {
          dxt5_block::flip_x((dxt5_block *)this_00,w,uVar1);
        }
      }
      peVar3 = get_element(in_RDI,in_ESI,local_14,local_18);
      *(dxt1_block **)peVar3->m_bytes = this_00;
      peVar3 = get_element(in_RDI,block_x,local_14,local_18);
      *(undefined8 *)peVar3->m_bytes = uVar4;
    }
  }
  return;
}

Assistant:

void dxt_image::flip_col(uint x) {
  const uint other_x = (m_blocks_x - 1) - x;
  for (uint y = 0; y < m_blocks_y; y++) {
    for (uint e = 0; e < get_elements_per_block(); e++) {
      element tmp[2] = {get_element(x, y, e), get_element(other_x, y, e)};

      for (uint i = 0; i < 2; i++) {
        switch (get_element_type(e)) {
          case cColorDXT1:
            reinterpret_cast<dxt1_block*>(&tmp[i])->flip_x();
            break;
          case cAlphaDXT3:
            reinterpret_cast<dxt3_block*>(&tmp[i])->flip_x();
            break;
          case cAlphaDXT5:
            reinterpret_cast<dxt5_block*>(&tmp[i])->flip_x();
            break;
          default:
            CRNLIB_ASSERT(0);
            break;
        }
      }

      get_element(x, y, e) = tmp[1];
      get_element(other_x, y, e) = tmp[0];
    }
  }
}